

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O1

Graph * Omega_h::edges_across_tets(Graph *__return_storage_ptr__,Adj *r2e,Adj *e2r)

{
  Alloc *pAVar1;
  int *piVar2;
  int iVar3;
  void *pvVar4;
  undefined8 uVar5;
  long *plVar6;
  Alloc **__dest;
  ulong *puVar7;
  long lVar8;
  int iVar9;
  size_t sVar10;
  Alloc *pAVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  size_t sVar15;
  byte bVar16;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  string __str;
  LOs er2r;
  LOs e2er;
  type f;
  Write<int> ee2e;
  LOs e2ee;
  Read<signed_char> e2er_codes;
  LOs re2e;
  size_type __dnew;
  ScopedTimer local_1ca;
  ScopedTimer local_1c9;
  Alloc **local_1c8;
  Alloc *local_1c0;
  Alloc *local_1b8 [2];
  undefined1 local_1a8 [32];
  Alloc *local_188;
  void *local_180;
  Alloc *local_178;
  void *local_170;
  Alloc *local_168;
  void *local_160;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  Alloc *local_130;
  void *local_128;
  Alloc *local_120;
  void *local_118;
  Alloc *local_110;
  void *local_108;
  undefined1 local_100 [32];
  Alloc *local_e0;
  void *local_d8;
  Alloc *local_d0;
  void *pvStack_c8;
  Write<int> local_c0;
  Alloc *local_b0;
  void *local_a8;
  Alloc *local_a0;
  void *local_98;
  Alloc *local_90;
  void *local_88;
  Alloc *local_80;
  long local_78;
  ulong local_70;
  undefined1 local_60 [16];
  Write<int> local_50;
  Read<signed_char> local_40;
  
  local_150 = &local_140;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_150);
  pAVar11 = (Alloc *)(plVar6 + 2);
  if ((Alloc *)*plVar6 == pAVar11) {
    local_100._0_8_ = pAVar11->size;
    local_100._8_8_ = plVar6[3];
    local_110 = (Alloc *)local_100;
  }
  else {
    local_100._0_8_ = pAVar11->size;
    local_110 = (Alloc *)*plVar6;
  }
  local_108 = (void *)plVar6[1];
  *plVar6 = (long)pAVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct((ulong)&local_1c8,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1c8,3,0x235);
  pAVar11 = (Alloc *)0xf;
  if (local_110 != (Alloc *)local_100) {
    pAVar11 = (Alloc *)local_100._0_8_;
  }
  if (pAVar11 < (Alloc *)((long)local_1c0 + (long)local_108)) {
    pAVar11 = (Alloc *)0xf;
    if (local_1c8 != local_1b8) {
      pAVar11 = local_1b8[0];
    }
    if (pAVar11 < (Alloc *)((long)local_1c0 + (long)local_108)) goto LAB_001d3358;
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_110)
    ;
  }
  else {
LAB_001d3358:
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_1c8);
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  pAVar11 = (Alloc *)(plVar6 + 2);
  if ((Alloc *)*plVar6 == pAVar11) {
    local_1a8._16_8_ = pAVar11->size;
    local_1a8._24_8_ = plVar6[3];
  }
  else {
    local_1a8._16_8_ = pAVar11->size;
    local_1a8._0_8_ = (Alloc *)*plVar6;
  }
  local_1a8._8_8_ = plVar6[1];
  *plVar6 = (long)pAVar11;
  plVar6[1] = 0;
  *(undefined1 *)&pAVar11->size = 0;
  begin_code("edges_across_tets",(char *)local_1a8._0_8_);
  pAVar11 = (Alloc *)(local_1a8 + 0x10);
  if ((Alloc *)local_1a8._0_8_ != pAVar11) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,(ulong)((long)&local_1b8[0]->size + 1));
  }
  if (local_110 != (Alloc *)local_100) {
    operator_delete(local_110,(ulong)((long)(size_t *)local_100._0_8_ + 1));
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  local_90 = (r2e->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90 = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  local_88 = (r2e->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_120 = (e2r->super_Graph).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120 = (Alloc *)(local_120->size * 8 + 1);
    }
    else {
      local_120->use_count = local_120->use_count + 1;
    }
  }
  local_118 = (e2r->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
  local_130 = (e2r->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_130 & 7) == 0 && local_130 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_130 = (Alloc *)(local_130->size * 8 + 1);
    }
    else {
      local_130->use_count = local_130->use_count + 1;
    }
  }
  local_128 = (e2r->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_a0 = (e2r->codes).write_.shared_alloc_.alloc;
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (Alloc *)(local_a0->size * 8 + 1);
    }
    else {
      local_a0->use_count = local_a0->use_count + 1;
    }
  }
  local_98 = (e2r->codes).write_.shared_alloc_.direct_ptr;
  if (((ulong)local_120 & 1) == 0) {
    sVar10 = local_120->size;
  }
  else {
    sVar10 = (ulong)local_120 >> 3;
  }
  local_b0 = local_120;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)(local_120->size * 8 + 1);
    }
    else {
      local_120->use_count = local_120->use_count + 1;
    }
  }
  if (((ulong)local_130 & 1) == 0) {
    sVar15 = local_130->size;
  }
  else {
    sVar15 = (ulong)local_130 >> 3;
  }
  local_1a8._0_8_ = pAVar11;
  local_a8 = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"edge edges to edges","");
  Write<int>::Write(&local_c0,(LO)(sVar15 >> 2),(string *)local_1a8);
  if ((Alloc *)local_1a8._0_8_ != pAVar11) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_110 = local_120;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_110 = (Alloc *)(local_120->size * 8 + 1);
    }
    else {
      local_120->use_count = local_120->use_count + 1;
    }
  }
  local_108 = local_118;
  local_100._0_8_ = local_130;
  if (((ulong)local_130 & 7) == 0 && local_130 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100._0_8_ = local_130->size * 8 + 1;
    }
    else {
      local_130->use_count = local_130->use_count + 1;
    }
  }
  local_100._8_8_ = local_128;
  local_100._16_8_ = local_a0;
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100._16_8_ = local_a0->size * 8 + 1;
    }
    else {
      local_a0->use_count = local_a0->use_count + 1;
    }
  }
  local_100._24_8_ = local_98;
  local_e0 = local_90;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0 = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  local_d8 = local_88;
  local_d0 = local_c0.shared_alloc_.alloc;
  if (((ulong)local_c0.shared_alloc_.alloc & 7) == 0 && local_c0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_d0 = (Alloc *)((local_c0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_c0.shared_alloc_.alloc)->use_count = (local_c0.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_c8 = local_c0.shared_alloc_.direct_ptr;
  local_1c8 = local_1b8;
  local_80 = (Alloc *)0x5d;
  __dest = (Alloc **)std::__cxx11::string::_M_create((ulong *)&local_1c8,(ulong)&local_80);
  pAVar1 = local_80;
  local_1b8[0] = local_80;
  local_1c8 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_1c0 = pAVar1;
  *(undefined1 *)((long)__dest + (long)pAVar1) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  puVar7 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar7) {
    local_140 = *puVar7;
    lStack_138 = plVar6[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar7;
    local_150 = (ulong *)*plVar6;
  }
  local_148 = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_80 = (Alloc *)&local_70;
  std::__cxx11::string::_M_construct((ulong)&local_80,'\x02');
  *(undefined2 *)&local_80->size = 0x3438;
  uVar12 = 0xf;
  if (local_150 != &local_140) {
    uVar12 = local_140;
  }
  if (uVar12 < (ulong)(local_78 + local_148)) {
    uVar12 = 0xf;
    if (local_80 != (Alloc *)&local_70) {
      uVar12 = local_70;
    }
    if ((ulong)(local_78 + local_148) <= uVar12) {
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_80,0,(char *)0x0,(ulong)local_150);
      goto LAB_001d3938;
    }
  }
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_80);
LAB_001d3938:
  pAVar1 = (Alloc *)(plVar6 + 2);
  if ((Alloc *)*plVar6 == pAVar1) {
    local_1a8._16_8_ = pAVar1->size;
    local_1a8._24_8_ = plVar6[3];
    local_1a8._0_8_ = pAVar11;
  }
  else {
    local_1a8._16_8_ = pAVar1->size;
    local_1a8._0_8_ = (Alloc *)*plVar6;
  }
  local_1a8._8_8_ = plVar6[1];
  *plVar6 = (long)pAVar1;
  plVar6[1] = 0;
  *(undefined1 *)&pAVar1->size = 0;
  begin_code("parallel_for",(char *)local_1a8._0_8_);
  if ((Alloc *)local_1a8._0_8_ != pAVar11) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  if (local_80 != (Alloc *)&local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,(ulong)((long)&local_1b8[0]->size + 1));
  }
  pvVar4 = pvStack_c8;
  iVar9 = (int)(sVar10 >> 2);
  if (1 < iVar9) {
    local_1a8._0_8_ = local_110;
    if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
      local_1a8._0_8_ = local_110->size * 8 + 1;
    }
    local_1a8._8_8_ = local_108;
    local_1a8._16_8_ = local_100._0_8_;
    if ((local_100._0_8_ & 7) == 0 && (Alloc *)local_100._0_8_ != (Alloc *)0x0) {
      local_1a8._16_8_ = *(size_t *)local_100._0_8_ * 8 + 1;
    }
    local_1a8._24_8_ = local_100._8_8_;
    local_188 = (Alloc *)local_100._16_8_;
    if ((local_100._16_8_ & 7) == 0 && (Alloc *)local_100._16_8_ != (Alloc *)0x0) {
      local_188 = (Alloc *)(*(size_t *)local_100._16_8_ * 8 + 1);
    }
    local_180 = (void *)local_100._24_8_;
    local_178 = local_e0;
    if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
      local_178 = (Alloc *)(local_e0->size * 8 + 1);
    }
    local_170 = local_d8;
    local_168 = local_d0;
    local_160 = pvStack_c8;
    if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
      local_d0->use_count = local_d0->use_count + -1;
      local_168 = (Alloc *)(local_d0->size * 8 + 1);
    }
    local_d0 = (Alloc *)0x0;
    pvStack_c8 = (void *)0x0;
    entering_parallel = '\0';
    lVar8 = 0;
    do {
      iVar14 = *(int *)((long)local_108 + lVar8 * 4);
      lVar13 = (long)iVar14;
      iVar3 = *(int *)((long)local_108 + lVar8 * 4 + 4);
      if (iVar14 < iVar3) {
        do {
          bVar16 = *(char *)(local_100._24_8_ + lVar13) >> 3;
          iVar14 = -1;
          if (bVar16 < 6) {
            iVar14 = *(int *)(&DAT_0044ebb8 + (ulong)bVar16 * 4);
          }
          *(undefined4 *)((long)pvVar4 + lVar13 * 4) =
               *(undefined4 *)
                ((long)local_d8 +
                ((long)iVar14 + (long)*(int *)(local_100._8_8_ + lVar13 * 4) * 6) * 4);
          lVar13 = lVar13 + 1;
        } while (iVar3 != lVar13);
      }
      lVar8 = lVar8 + 1;
    } while (iVar9 + -1 != (int)lVar8);
    edges_across_tets(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)local_1a8);
  }
  ScopedTimer::~ScopedTimer(&local_1c9);
  local_60._0_8_ = local_b0;
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60._0_8_ = local_b0->size * 8 + 1;
    }
    else {
      local_b0->use_count = local_b0->use_count + 1;
    }
  }
  local_60._8_8_ = local_a8;
  local_50.shared_alloc_.alloc = local_c0.shared_alloc_.alloc;
  if (((ulong)local_c0.shared_alloc_.alloc & 7) == 0 && local_c0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_50.shared_alloc_.alloc = (Alloc *)((local_c0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_c0.shared_alloc_.alloc)->use_count = (local_c0.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_50.shared_alloc_.direct_ptr = local_c0.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_40,&local_50);
  Adj::Adj((Adj *)local_1a8,(LOs *)local_60,(LOs *)&local_40);
  (__return_storage_ptr__->a2ab).write_.shared_alloc_.alloc = (Alloc *)local_1a8._0_8_;
  (__return_storage_ptr__->a2ab).write_.shared_alloc_.direct_ptr = (void *)local_1a8._8_8_;
  if (((local_1a8._0_8_ & 7) == 0 && (Alloc *)local_1a8._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_1a8._0_8_ + 0x30) = *(int *)(local_1a8._0_8_ + 0x30) + -1;
    (__return_storage_ptr__->a2ab).write_.shared_alloc_.alloc =
         (Alloc *)(*(long *)local_1a8._0_8_ * 8 + 1);
  }
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = (void *)0x0;
  (__return_storage_ptr__->ab2b).write_.shared_alloc_.alloc = (Alloc *)local_1a8._16_8_;
  (__return_storage_ptr__->ab2b).write_.shared_alloc_.direct_ptr = (void *)local_1a8._24_8_;
  if (((local_1a8._16_8_ & 7) == 0 && (Alloc *)local_1a8._16_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_1a8._16_8_ + 0x30) = *(int *)(local_1a8._16_8_ + 0x30) + -1;
    (__return_storage_ptr__->ab2b).write_.shared_alloc_.alloc =
         (Alloc *)(*(long *)local_1a8._16_8_ * 8 + 1);
  }
  local_1a8._16_8_ = 0;
  local_1a8._24_8_ = 0;
  Adj::~Adj((Adj *)local_1a8);
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_40.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(local_40.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar11 = local_50.shared_alloc_.alloc;
  if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 && local_50.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = (int *)((long)local_50.shared_alloc_.alloc + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_50.shared_alloc_.alloc);
      operator_delete(pAVar11,0x48);
    }
  }
  uVar5 = local_60._0_8_;
  if ((local_60._0_8_ & 7) == 0 && (Alloc *)local_60._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_60._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_60._0_8_);
      operator_delete((void *)uVar5,0x48);
    }
  }
  edges_across_tets(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)&local_110);
  if (((ulong)local_c0.shared_alloc_.alloc & 7) == 0 && local_c0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_c0.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_c0.shared_alloc_.alloc);
      operator_delete(local_c0.shared_alloc_.alloc,0x48);
    }
  }
  pAVar11 = local_b0;
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    piVar2 = &local_b0->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_b0);
      operator_delete(pAVar11,0x48);
    }
  }
  pAVar11 = local_a0;
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    piVar2 = &local_a0->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_a0);
      operator_delete(pAVar11,0x48);
    }
  }
  pAVar11 = local_130;
  if (((ulong)local_130 & 7) == 0 && local_130 != (Alloc *)0x0) {
    piVar2 = &local_130->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_130);
      operator_delete(pAVar11,0x48);
    }
  }
  pAVar11 = local_120;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    piVar2 = &local_120->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_120);
      operator_delete(pAVar11,0x48);
    }
  }
  pAVar11 = local_90;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    piVar2 = &local_90->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_90);
      operator_delete(pAVar11,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_1ca);
  return __return_storage_ptr__;
}

Assistant:

Graph edges_across_tets(Adj const r2e, Adj const e2r) {
  OMEGA_H_TIME_FUNCTION;
  auto const re2e = r2e.ab2b;
  auto const e2er = e2r.a2ab;
  auto const er2r = e2r.ab2b;
  auto const e2er_codes = e2r.codes;
  auto const ne = e2er.size() - 1;
  auto const e2ee = e2er;
  Write<LO> ee2e(er2r.size(), "edge edges to edges");
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto const er_begin = e2er[e];
    auto const er_end = e2er[e + 1];
    for (auto er = er_begin; er < er_end; ++er) {
      auto const r = er2r[er];
      auto const e2er_code = e2er_codes[er];
      auto const rre = code_which_down(e2er_code);
      auto const rre_opp = simplex_opposite_template(REGION, EDGE, rre);
      auto const re_begin = r * 6;
      auto const e_opp = re2e[re_begin + rre_opp];
      auto const ee = er;
      ee2e[ee] = e_opp;
    }
  };
  parallel_for(ne, std::move(f));
  return Adj(e2ee, ee2e);
}